

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

void ReadStringFromFile(FILE *file_ptr,string *str)

{
  ostream *poVar1;
  Logger *this;
  size_t len;
  size_t local_70;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (file_ptr == (FILE *)0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_70 = CONCAT44(local_70._4_4_,2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ReadStringFromFile","");
    poVar1 = Logger::Start(ERR,&local_60,0x135,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x135);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"file_ptr",8);
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    this = (Logger *)&local_70;
  }
  else {
    local_70 = 0;
    ReadDataFromDisk(file_ptr,(char *)&local_70,8);
    if (local_70 != 0) {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::swap((string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      std::__cxx11::string::resize((ulong)str,(char)local_70);
      ReadDataFromDisk(file_ptr,(str->_M_dataplus)._M_p,local_70);
      return;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_64.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,"");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ReadStringFromFile","");
    poVar1 = Logger::Start(ERR,&local_60,0x139,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x139);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"len",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    this = &local_64;
  }
  Logger::~Logger(this);
  abort();
}

Assistant:

inline void ReadStringFromFile(FILE *file_ptr, std::string &str) {
  CHECK_NOTNULL(file_ptr);
  // First, read the length of vector
  size_t len = 0;
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  CHECK_GT(len, 0);
  // Clear the original string
  std::string().swap(str);
  str.resize(len);
  ReadDataFromDisk(file_ptr, const_cast<char *>(str.data()), len);
}